

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_adjoin_maxtrix.h
# Opt level: O1

void __thiscall
adjMaxtrix<char>::CreatGraph(adjMaxtrix<char> *this,char *V,int n,RowColWeight *E,int e)

{
  long lVar1;
  ulong uVar2;
  
  if (0 < n) {
    uVar2 = 0;
    do {
      InsertVertex(this,V[uVar2]);
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  if (0 < e) {
    lVar1 = 0;
    do {
      InsertEdge(this,*(int *)((long)&E->row + lVar1),*(int *)((long)&E->col + lVar1),
                 *(int *)((long)&E->weight + lVar1));
      lVar1 = lVar1 + 0xc;
    } while ((ulong)(uint)e * 0xc != lVar1);
  }
  return;
}

Assistant:

void adjMaxtrix<dataType>::CreatGraph(dataType V[], int n, RowColWeight E[], int e)
{
	int i, k;
	//Initiate(n);	//顶点顺序表初始化
	for (i = 0; i < n; i++)
		InsertVertex(V[i]);	//插入顶点
	for (k = 0; k < e; k++)
		InsertEdge(E[k].row, E[k].col, E[k].weight);//插入边
}